

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O3

float __thiscall FTexCoordInfo::TextureOffset(FTexCoordInfo *this,float textureoffset)

{
  float fVar1;
  
  fVar1 = (this->mTempScale).X;
  if (fVar1 == 1.0) {
    fVar1 = (this->mScale).X;
    if ((fVar1 == 1.0) || (this->mWorldPanning != false)) {
      return textureoffset;
    }
  }
  else if (this->mWorldPanning != true) {
    return textureoffset / (this->mScale).X;
  }
  return textureoffset / fVar1;
}

Assistant:

float FTexCoordInfo::TextureOffset(float textureoffset) const
{
	if (mTempScale.X == 1.f)
	{
		if (mScale.X == 1.f || mWorldPanning) return textureoffset;
		else return textureoffset / mScale.X;
	}
	else
	{
		if (mWorldPanning) return textureoffset / mTempScale.X;
		else return textureoffset / mScale.X;
	}
}